

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

bool anon_unknown.dwarf_1f63b7::getStreamContents
               (InputStream *stream,vector<char,_std::allocator<char>_> *buffer)

{
  ulong in_RAX;
  size_type __new_size;
  size_type sVar1;
  bool bVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  __new_size = (**(code **)(*(long *)stream + 0x28))();
  if ((long)__new_size < 1) {
    bVar2 = true;
  }
  else {
    std::vector<char,_std::allocator<char>_>::resize(buffer,__new_size);
    (**(code **)(*(long *)stream + 0x18))(stream,0);
    sVar1 = (**(code **)(*(long *)stream + 0x10))
                      (stream,(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start,__new_size);
    bVar2 = sVar1 == __new_size;
  }
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>
            (buffer,(char *)((long)&uStack_28 + 7));
  return bVar2;
}

Assistant:

bool getStreamContents(sf::InputStream& stream, std::vector<char>& buffer)
    {
        bool success = true;
        sf::Int64 size = stream.getSize();
        if (size > 0)
        {
            buffer.resize(static_cast<std::size_t>(size));
            stream.seek(0);
            sf::Int64 read = stream.read(&buffer[0], size);
            success = (read == size);
        }
        buffer.push_back('\0');
        return success;
    }